

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O1

GLuint deqp::gls::TextureSamplerTest::createTexture(Functions *gl,GLenum target)

{
  GLenum GVar1;
  GLuint GVar2;
  GLuint GStack_8c;
  Vec4 VStack_88;
  Texture3D TStack_78;
  undefined1 *puStack_20;
  undefined1 *puStack_18;
  
  if (target == 0x8513) {
    createTextureCube(gl);
  }
  else {
    if (target == 0x806f) {
      GStack_8c = 0xffffffff;
      VStack_88.m_data[0] = 1.12104e-44;
      VStack_88.m_data[1] = 4.2039e-45;
      tcu::Texture3D::Texture3D(&TStack_78,(TextureFormat *)&VStack_88,0x20,0x20,0x20);
      tcu::Texture3D::allocLevel(&TStack_78,0);
      VStack_88.m_data[0] = 0.0;
      VStack_88.m_data[1] = 0.0;
      VStack_88.m_data[2] = 0.0;
      VStack_88.m_data[3] = 0.0;
      puStack_20 = &DAT_3f8000003f800000;
      puStack_18 = &DAT_3f8000003f800000;
      tcu::fillWithComponentGradients
                (TStack_78.super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start,&VStack_88,(Vec4 *)&puStack_20);
      (*gl->genTextures)(1,&GStack_8c);
      GVar1 = (*gl->getError)();
      glu::checkError(GVar1,"glGenTextures(1, &texture)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x19e);
      (*gl->bindTexture)(0x806f,GStack_8c);
      GVar1 = (*gl->getError)();
      glu::checkError(GVar1,"glBindTexture(GL_TEXTURE_3D, texture)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x1a1);
      (*gl->texImage3D)(0x806f,0,0x8058,TStack_78.m_width,TStack_78.m_height,TStack_78.m_depth,0,
                        0x1908,0x1401,
                        ((TStack_78.super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                        m_data);
      GVar1 = (*gl->getError)();
      glu::checkError(GVar1,
                      "glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA8, refTexture.getWidth(), refTexture.getHeight(), refTexture.getDepth(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevel(0).getDataPtr())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x1a4);
      (*gl->generateMipmap)(0x806f);
      GVar1 = (*gl->getError)();
      glu::checkError(GVar1,"glGenerateMipmap(GL_TEXTURE_3D)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x1a7);
      (*gl->bindTexture)(0x806f,0);
      GVar1 = (*gl->getError)();
      glu::checkError(GVar1,"glBindTexture(GL_TEXTURE_3D, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x1aa);
      GVar2 = GStack_8c;
      tcu::Texture3D::~Texture3D(&TStack_78);
      return GVar2;
    }
    if (target == 0xde1) {
      GVar2 = createTexture2D(gl);
      return GVar2;
    }
  }
  return 0xffffffff;
}

Assistant:

GLuint TextureSamplerTest::createTexture (const glw::Functions& gl, GLenum target)
{
	switch (target)
	{
		case GL_TEXTURE_2D:
			return createTexture2D(gl);

		case GL_TEXTURE_3D:
			return createTexture3D(gl);

		case GL_TEXTURE_CUBE_MAP:
			return createTextureCube(gl);

		default:
			DE_ASSERT(false);
			return (GLuint)-1;
	}
}